

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O2

void chatra::emb::io::fileInputStream_close(Ct *ct)

{
  FileInputStreamData *pFVar1;
  
  pFVar1 = derefSelfAsInput(ct);
  std::mutex::lock(&pFVar1->mt);
  (*((pFVar1->file)._M_t.super___uniq_ptr_impl<chatra::IFile,_std::default_delete<chatra::IFile>_>.
     _M_t.super__Tuple_impl<0UL,_chatra::IFile_*,_std::default_delete<chatra::IFile>_>.
     super__Head_base<0UL,_chatra::IFile_*,_false>._M_head_impl)->_vptr_IFile[2])();
  pthread_mutex_unlock((pthread_mutex_t *)&pFVar1->mt);
  return;
}

Assistant:

static void fileInputStream_close(Ct& ct) {
	auto* self = derefSelfAsInput(ct);
	std::lock_guard<std::mutex> lock(self->mt);
	self->file->close();
}